

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msvc_objectmodel.h
# Opt level: O0

void __thiscall FlatNode::addElement(FlatNode *this,QString *filepath,VCFilterFile *allInfo)

{
  int iVar1;
  longlong in_RSI;
  QString *in_RDI;
  long in_FS_OFFSET;
  int index;
  QString newKey;
  QString *in_stack_ffffffffffffff38;
  QStringBuilder<QStringBuilder<QString_&,_const_char_(&)[2]>,_const_QString_&> *this_00;
  QString *in_stack_ffffffffffffff40;
  VCFilterFile *value;
  QString *key;
  QMap<QString,_VCFilterFile> *this_01;
  FlatNode *in_stack_ffffffffffffff60;
  QStringBuilder<QStringBuilder<QString_&,_const_char_(&)[2]>,_const_QString_&> local_68;
  QString local_50;
  undefined1 local_38 [24];
  QMap<QString,_VCFilterFile> local_20;
  undefined8 local_18;
  undefined8 local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_20.d.d.ptr =
       (QExplicitlySharedDataPointerV2<QMapData<std::map<QString,_VCFilterFile,_std::less<QString>,_std::allocator<std::pair<const_QString,_VCFilterFile>_>_>_>_>
        )(totally_ordered_wrapper<QMapData<std::map<QString,_VCFilterFile,_std::less<QString>,_std::allocator<std::pair<const_QString,_VCFilterFile>_>_>_>_*>
          )0xaaaaaaaaaaaaaaaa;
  local_18 = 0xaaaaaaaaaaaaaaaa;
  local_10 = 0xaaaaaaaaaaaaaaaa;
  QString::QString(in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
  iVar1 = pathIndex(in_stack_ffffffffffffff60,in_RDI);
  if (iVar1 != -1) {
    QString::mid((longlong)local_38,in_RSI);
    QString::operator=(in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
    QString::~QString((QString *)0x27e213);
  }
  value = (VCFilterFile *)&(in_RDI->d).ptr;
  this_01 = &local_20;
  ::operator+((QString *)value,(char (*) [2])in_stack_ffffffffffffff38);
  this_00 = &local_68;
  ::operator+((QStringBuilder<QString_&,_const_char_(&)[2]> *)value,(QString *)this_00);
  key = &local_50;
  ::QStringBuilder::operator_cast_to_QString(this_00);
  QMap<QString,_VCFilterFile>::insert(this_01,key,value);
  QString::~QString((QString *)0x27e296);
  QString::~QString((QString *)0x27e2a0);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void addElement(const QString &filepath, const VCFilterFile &allInfo) override {
        QString newKey(filepath);

        int index = pathIndex(filepath);
        if (index != -1)
            newKey = filepath.mid(index+1);

        // Key designed to sort files with same
        // name in different paths correctly
        children.insert(newKey + "\0" + allInfo.file, allInfo);
    }